

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_fdiv_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  float32 fVar8;
  float64 fVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_40 [2];
  
  lVar4 = (ulong)ws * 0x10 + 0x338;
  lVar5 = (ulong)wt * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar14 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = float32_div_mips64(*(float32 *)
                                  ((long)(env->active_fpu).fpr + lVar14 * 4 + lVar4 + -0x338),
                                 *(float32 *)
                                  ((long)(env->active_fpu).fpr + lVar14 * 4 + lVar5 + -0x338),pfVar2
                                );
      *(float32 *)((long)local_40 + lVar14 * 4) = fVar8;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = (uint)bVar3;
      if ((fVar8 & 0x7f800000) == 0) {
        uVar13 = uVar13 | 0x10;
      }
      if ((fVar8 & 0x7fffffff) == 0) {
        uVar13 = (uint)bVar3;
      }
      uVar6 = ieee_ex_to_mips_mips64(uVar13);
      uVar10 = (env->active_tc).msacsr;
      uVar12 = (uVar10 & 0x1000000) >> 0x18 & uVar13 >> 6;
      uVar11 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar11 = uVar12;
      }
      if (uVar13 < 0x80) {
        uVar11 = uVar12;
      }
      uVar11 = uVar11 | uVar6;
      uVar7 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar12 = uVar7 | uVar11;
      uVar13 = uVar6 & 0xfffffffc;
      if ((uVar7 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar13 = uVar12;
      }
      if ((uVar11 & 2) == 0) {
        uVar13 = uVar12;
      }
      if ((uVar13 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar11 = uVar13 << 0xc;
LAB_008cccc9:
        (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar11 = uVar13 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_008cccc9;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar13) != 0) {
        fVar8 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)local_40 + lVar14 * 4) = fVar8 & 0xffffffc0 ^ 0x400000 | uVar13;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x190f,
                    "void helper_msa_fdiv_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar14 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar9 = float64_div_mips64(*(float64 *)
                                  ((long)(env->active_fpu).fpr + lVar14 * 8 + lVar4 + -0x338),
                                 *(float64 *)
                                  ((long)(env->active_fpu).fpr + lVar14 * 8 + lVar5 + -0x338),pfVar2
                                );
      local_40[lVar14] = fVar9;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = (uint)bVar3;
      if ((fVar9 & 0x7ff0000000000000) == 0) {
        uVar13 = uVar13 | 0x10;
      }
      if ((fVar9 & 0x7fffffffffffffff) == 0) {
        uVar13 = (uint)bVar3;
      }
      uVar6 = ieee_ex_to_mips_mips64(uVar13);
      uVar10 = (env->active_tc).msacsr;
      uVar12 = (uVar10 & 0x1000000) >> 0x18 & uVar13 >> 6;
      uVar11 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar11 = uVar12;
      }
      if (uVar13 < 0x80) {
        uVar11 = uVar12;
      }
      uVar11 = uVar11 | uVar6;
      uVar7 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar12 = uVar7 | uVar11;
      uVar13 = uVar6 & 0xfffffffc;
      if ((uVar7 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar13 = uVar12;
      }
      if ((uVar11 & 2) == 0) {
        uVar13 = uVar12;
      }
      if ((uVar13 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar11 = uVar13 << 0xc;
LAB_008ccb8a:
        (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar11 = uVar13 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_008ccb8a;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar13) != 0) {
        fVar9 = float64_default_nan_mips64(pfVar2);
        local_40[lVar14] = (long)(int)uVar13 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
  }
  uVar13 = (env->active_tc).msacsr;
  uVar10 = uVar13 >> 7 & 0x1f | 0x20;
  if ((uVar10 & uVar13 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar10);
  }
  (env->active_tc).msacsr = (uVar13 >> 0xc & 0x1f) << 2 | uVar13;
  (env->active_fpu).fpr[wd].fd = local_40[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_40[1];
  return;
}

Assistant:

void helper_msa_fdiv_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_BINOP(pwx->w[i], div, pws->w[i], pwt->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_BINOP(pwx->d[i], div, pws->d[i], pwt->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}